

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O2

int libcmsockets_LTX_self_check
              (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
              attr_list attrs)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int host_addr;
  char *host_name;
  int int_port_num;
  char my_host_name [256];
  
  pvVar3 = trans->trans_data;
  get_IP_config(my_host_name,8,&libcmsockets_LTX_self_check::IP,(int *)0x0,(int *)0x0,(int *)0x0,
                (attr_list)0x0,svc->trace_out,cm);
  if (libcmsockets_LTX_self_check::IP == 0) {
    libcmsockets_LTX_self_check::IP = 0x7f000001;
  }
  iVar4 = query_attr(attrs,CM_IP_HOSTNAME,0,&host_name);
  if (iVar4 == 0) {
    (*svc->trace_out)(cm,"CMself check TCP/IP transport found no IP_HOST attribute");
    host_name = (char *)0x0;
  }
  iVar4 = query_attr(attrs,CM_IP_ADDR,0,&host_addr);
  if (iVar4 == 0) {
    (*svc->trace_out)(cm,"CMself check TCP/IP transport found no IP_ADDR attribute");
    if (host_name == (char *)0x0) {
      return 0;
    }
    host_addr = 0;
  }
  iVar4 = query_attr(attrs,CM_IP_PORT,0,&int_port_num);
  if (iVar4 == 0) {
    pcVar7 = "CMself check TCP/IP transport found no IP_PORT attribute";
  }
  else {
    if ((host_name == (char *)0x0) || (iVar4 = strcmp(host_name,my_host_name), iVar4 == 0)) {
      if ((host_addr != 0) && (libcmsockets_LTX_self_check::IP != host_addr)) {
        (*svc->trace_out)(cm,"CMself check - Host IP addrs don\'t match, %lx, %lx");
        return 0;
      }
      uVar1 = *(uint *)((long)pvVar3 + 0x10);
      uVar6 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar6;
      }
      iVar4 = 0;
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar2 = *(int *)(*(long *)((long)pvVar3 + 0x20) + uVar6 * 4);
        if (int_port_num == iVar2) {
          iVar4 = iVar2;
        }
      }
      if (iVar4 != 0) {
        (*svc->trace_out)(cm,"CMself check returning TRUE");
        return 1;
      }
      (*svc->trace_out)(cm,"CMself check - Ports don\'t match, %d, %d",(ulong)(uint)int_port_num,0);
      return 0;
    }
    pcVar7 = "CMself check - Hostnames don\'t match";
  }
  (*svc->trace_out)(cm,pcVar7);
  return 0;
}

Assistant:

extern int
libcmsockets_LTX_self_check(CManager cm, CMtrans_services svc, transport_entry trans, attr_list attrs)
{

    socket_client_data_ptr sd = trans->trans_data;
    int host_addr;
    int int_port_num;
    char *host_name;
    char my_host_name[256];
    static int IP = 0;

    get_IP_config(my_host_name, sizeof(host_name), &IP, NULL, NULL, NULL,
		  NULL, svc->trace_out, (void *)cm);

    if (IP == 0) {
	if (IP == 0) IP = INADDR_LOOPBACK;
    }
    if (!query_attr(attrs, CM_IP_HOSTNAME, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_name)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_HOST attribute");
	host_name = NULL;
    }
    if (!query_attr(attrs, CM_IP_ADDR, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_addr)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_ADDR attribute");
	if (host_name == NULL) return 0;
	host_addr = 0;
    }
    if (!query_attr(attrs, CM_IP_PORT, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & int_port_num)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_PORT attribute");
	return 0;
    }
    if (host_name && (strcmp(host_name, my_host_name) != 0)) {
	svc->trace_out(cm, "CMself check - Hostnames don't match");
	return 0;
    }
    if (host_addr && (IP != host_addr)) {
	svc->trace_out(cm, "CMself check - Host IP addrs don't match, %lx, %lx", IP, host_addr);
	return 0;
    }
    int port_match = 0;
    for (int i = 0; i < sd->listen_count; i++) {
	if (int_port_num == sd->listen_ports[i]) {
	    port_match = sd->listen_ports[i];
	}
    }
    if (!port_match) {
	svc->trace_out(cm, "CMself check - Ports don't match, %d, %d", int_port_num, port_match);
	return 0;
    }
    svc->trace_out(cm, "CMself check returning TRUE");
    return 1;
}